

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O2

void check_variant_empty<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *var)

{
  SourceLineInfo local_120;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
  local_c8;
  strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
  local_98;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x1c;
  Catch::StringRef::StringRef(&local_40,"!var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_40,Normal);
  local_c8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x1d;
  Catch::StringRef::StringRef(&local_50,"!var");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_50,Normal);
  local_c8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x20;
  Catch::StringRef::StringRef(&local_60,"var.type() == Variant::invalid_type");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_60,Normal);
  local_98.value_ =
       (var->storage_).storage_.cur_type_.
       super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
       .value_;
  local_120.file = (char *)&local_98;
  Catch::ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&>::operator==
            (&local_c8,
             (ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&> *)
             &local_120,
             &type_safe::
              basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
              invalid_type);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x21;
  Catch::StringRef::StringRef(&local_70,"var.has_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_70,Normal);
  local_c8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8.super_ITransientExpression._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::value
            (var);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x29;
  Catch::StringRef::StringRef(&local_80,"var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_80,Normal);
  local_120.file = (char *)0x0;
  if ((var->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 0) {
    local_120.file = "";
  }
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)&local_120;
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_optional<type_safe::reference_optional_storage<type_safe::nullvar_t_const,false>>const&>
            (&catchAssertionHandler,
             (ExprLhs<const_type_safe::basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>_&>
              *)&local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_120.line = 0x2a;
  Catch::StringRef::StringRef(&local_90,"!var.optional_value(variant_type<int>{})");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_120,local_90,Normal);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<int>((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                       *)&local_c8,var);
  local_120.file =
       (char *)CONCAT71(local_120.file._1_7_,
                        local_c8.super_ITransientExpression._vptr_ITransientExpression ==
                        (_func_int **)0x0);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_120);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void check_variant_empty(const Variant& var)
{
    // boolean queries
    REQUIRE(!var.has_value());
    REQUIRE(!var);

    // type queries
    REQUIRE(var.type() == Variant::invalid_type);
    REQUIRE(var.has_value(variant_type<nullvar_t>{}));

    // value query
    // (check that it compiles and does not abort)
    nullvar_t null = var.value(variant_type<nullvar_t>{});
    (void)null;

    // optional_value queries
    REQUIRE(var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(!var.optional_value(variant_type<int>{}));
}